

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O3

bool __thiscall
IRT::RegModRegPattern::TryToGenerateCode
          (RegModRegPattern *this,INode *tree,CTemp *dest,ChildrenTemps *children,
          AssemblyCommands *commands)

{
  TOperationType TVar1;
  CBinopExpression *this_00;
  CExpression *pCVar2;
  CTempExpression *pCVar3;
  CTemp *pCVar4;
  INode *pIVar5;
  CTemp leftRegister;
  undefined1 local_a8 [17];
  undefined7 uStack_97;
  undefined8 uStack_90;
  INode *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  undefined1 local_70;
  undefined7 uStack_6f;
  _Alloc_hider _Stack_68;
  INode *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined8 local_38;
  
  if (tree != (INode *)0x0) {
    this_00 = (CBinopExpression *)
              __dynamic_cast(tree,&INode::typeinfo,&CBinopExpression::typeinfo,0);
    if (this_00 == (CBinopExpression *)0x0) {
      return false;
    }
    TVar1 = CBinopExpression::getOperation(this_00);
    if (TVar1 == MOD) {
      pCVar2 = CBinopExpression::getLeftOperand(this_00);
      if ((pCVar2 == (CExpression *)0x0) ||
         (pCVar3 = (CTempExpression *)
                   __dynamic_cast(pCVar2,&CExpression::typeinfo,&CTempExpression::typeinfo,0),
         pCVar3 == (CTempExpression *)0x0)) {
        CTemp::CTemp((CTemp *)&local_58);
        pIVar5 = (INode *)CBinopExpression::getLeftOperand(this_00);
        local_80._M_allocated_capacity = (size_type)(MoveRegRegCommand *)&local_70;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,local_58._M_allocated_capacity,
                   (undefined1 *)(local_58._M_allocated_capacity + local_58._8_8_));
        if ((MoveRegRegCommand *)local_80._M_allocated_capacity == (MoveRegRegCommand *)&local_70) {
          uStack_90 = _Stack_68._M_p;
          local_a8._0_8_ = (MoveRegRegCommand *)(local_a8 + 0x10);
        }
        else {
          local_a8._0_8_ = local_80._M_allocated_capacity;
        }
        local_a8._8_8_ = local_80._8_8_;
        local_80._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_70 = 0;
        local_88 = pIVar5;
        local_80._M_allocated_capacity = (size_type)(MoveRegRegCommand *)&local_70;
        local_60 = pIVar5;
        local_38 = commands;
        std::
        vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
        ::emplace_back<std::pair<IRT::CTemp,IRT::INode_const*>>
                  ((vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
                    *)children,(pair<IRT::CTemp,_const_IRT::INode_*> *)local_a8);
        if ((MoveRegRegCommand *)local_a8._0_8_ != (MoveRegRegCommand *)(local_a8 + 0x10)) {
          operator_delete((void *)local_a8._0_8_);
        }
        commands = (AssemblyCommands *)local_38;
        if ((MoveRegRegCommand *)local_80._M_allocated_capacity != (MoveRegRegCommand *)&local_70) {
          operator_delete((void *)local_80._M_allocated_capacity);
        }
        local_a8._0_8_ = (MoveRegRegCommand *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<AssemblyCode::MoveRegRegCommand,std::allocator<AssemblyCode::MoveRegRegCommand>,IRT::CTemp_const&,IRT::CTemp&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8),
                   (MoveRegRegCommand **)local_a8,
                   (allocator<AssemblyCode::MoveRegRegCommand> *)&local_80,dest,(CTemp *)&local_58);
        std::
        vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
        ::emplace_back<std::shared_ptr<AssemblyCode::MoveRegRegCommand>>
                  ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                    *)commands,(shared_ptr<AssemblyCode::MoveRegRegCommand> *)local_a8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_allocated_capacity != &local_48) {
          operator_delete((void *)local_58._M_allocated_capacity);
        }
      }
      else {
        pCVar4 = CTempExpression::getTemprorary(pCVar3);
        local_a8._0_8_ = (MoveRegRegCommand *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<AssemblyCode::MoveRegRegCommand,std::allocator<AssemblyCode::MoveRegRegCommand>,IRT::CTemp_const&,IRT::CTemp_const&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8),
                   (MoveRegRegCommand **)local_a8,
                   (allocator<AssemblyCode::MoveRegRegCommand> *)&local_80,dest,pCVar4);
        std::
        vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
        ::emplace_back<std::shared_ptr<AssemblyCode::MoveRegRegCommand>>
                  ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                    *)commands,(shared_ptr<AssemblyCode::MoveRegRegCommand> *)local_a8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
        }
      }
      pCVar2 = CBinopExpression::getRightOperand(this_00);
      if ((pCVar2 == (CExpression *)0x0) ||
         (pCVar3 = (CTempExpression *)
                   __dynamic_cast(pCVar2,&CExpression::typeinfo,&CTempExpression::typeinfo,0),
         pCVar3 == (CTempExpression *)0x0)) {
        CTemp::CTemp((CTemp *)&local_58);
        pIVar5 = (INode *)CBinopExpression::getRightOperand(this_00);
        local_80._M_allocated_capacity = (size_type)(MoveRegRegCommand *)&local_70;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,local_58._M_allocated_capacity,
                   (undefined1 *)(local_58._M_allocated_capacity + local_58._8_8_));
        if ((MoveRegRegCommand *)local_80._M_allocated_capacity == (MoveRegRegCommand *)&local_70) {
          uStack_90 = _Stack_68._M_p;
          local_a8._0_8_ = (MoveRegRegCommand *)(local_a8 + 0x10);
        }
        else {
          local_a8._0_8_ = local_80._M_allocated_capacity;
        }
        uStack_97 = uStack_6f;
        local_a8[0x10] = local_70;
        local_a8._8_8_ = local_80._8_8_;
        local_80._8_8_ = 0;
        local_70 = 0;
        local_88 = pIVar5;
        local_80._M_allocated_capacity = (size_type)(MoveRegRegCommand *)&local_70;
        local_60 = pIVar5;
        std::
        vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
        ::emplace_back<std::pair<IRT::CTemp,IRT::INode_const*>>
                  ((vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
                    *)children,(pair<IRT::CTemp,_const_IRT::INode_*> *)local_a8);
        if ((MoveRegRegCommand *)local_a8._0_8_ != (MoveRegRegCommand *)(local_a8 + 0x10)) {
          operator_delete((void *)local_a8._0_8_);
        }
        if ((MoveRegRegCommand *)local_80._M_allocated_capacity != (MoveRegRegCommand *)&local_70) {
          operator_delete((void *)local_80._M_allocated_capacity);
        }
        local_a8._0_8_ = (MoveRegRegCommand *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<AssemblyCode::DivRegRegCommand,std::allocator<AssemblyCode::DivRegRegCommand>,IRT::CTemp_const&,IRT::CTemp&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8),
                   (DivRegRegCommand **)local_a8,
                   (allocator<AssemblyCode::DivRegRegCommand> *)&local_80,dest,(CTemp *)&local_58);
        std::
        vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
        ::emplace_back<std::shared_ptr<AssemblyCode::DivRegRegCommand>>
                  ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                    *)commands,(shared_ptr<AssemblyCode::DivRegRegCommand> *)local_a8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_allocated_capacity != &local_48) {
          operator_delete((void *)local_58._M_allocated_capacity);
        }
      }
      else {
        pCVar4 = CTempExpression::getTemprorary(pCVar3);
        local_a8._0_8_ = (MoveRegRegCommand *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<AssemblyCode::DivRegRegCommand,std::allocator<AssemblyCode::DivRegRegCommand>,IRT::CTemp_const&,IRT::CTemp_const&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8),
                   (DivRegRegCommand **)local_a8,
                   (allocator<AssemblyCode::DivRegRegCommand> *)&local_80,dest,pCVar4);
        std::
        vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
        ::emplace_back<std::shared_ptr<AssemblyCode::DivRegRegCommand>>
                  ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                    *)commands,(shared_ptr<AssemblyCode::DivRegRegCommand> *)local_a8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
        }
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool IRT::RegModRegPattern::TryToGenerateCode( const IRT::INode *tree, const IRT::CTemp &dest, ChildrenTemps &children,
                                               AssemblyCommands &commands ) {
    ConstBinopPtr binopPtr = dynamic_cast<ConstBinopPtr>(tree);
    if ( binopPtr && binopPtr->getOperation( ) == IRT::enums::TOperationType::MOD ) {
        ConstTempPtr leftRegisterPtr = dynamic_cast<ConstTempPtr>(binopPtr->getLeftOperand( ));
        if ( leftRegisterPtr ) {
            commands.emplace_back(
                    std::make_shared<AssemblyCode::MoveRegRegCommand>( dest, leftRegisterPtr->getTemprorary( )));
        } else {
            CTemp leftRegister;
            children.push_back( std::make_pair( leftRegister, binopPtr->getLeftOperand( )));
            commands.emplace_back( std::make_shared<AssemblyCode::MoveRegRegCommand>( dest, leftRegister ));
        }
        ConstTempPtr rightRegisterPtr = dynamic_cast<ConstTempPtr>(binopPtr->getRightOperand( ));
        if ( rightRegisterPtr ) {
            commands.emplace_back(
                    std::make_shared<AssemblyCode::DivRegRegCommand>( dest, rightRegisterPtr->getTemprorary( )));
        } else {
            CTemp rightRegister;
            children.push_back( std::make_pair( rightRegister, binopPtr->getRightOperand( )));
            commands.emplace_back( std::make_shared<AssemblyCode::DivRegRegCommand>( dest, rightRegister ));
        }
        return true;
    }
    return false;
}